

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module_util.cc
# Opt level: O0

PackedFunc *
tvm::runtime::WrapPackedFunc
          (PackedFunc *__return_storage_ptr__,BackendPackedCFunc faddr,
          shared_ptr<tvm::runtime::ModuleNode> *sptr_to_self)

{
  anon_class_24_2_1c8bf52c local_58;
  FType local_40;
  shared_ptr<tvm::runtime::ModuleNode> *local_20;
  shared_ptr<tvm::runtime::ModuleNode> *sptr_to_self_local;
  BackendPackedCFunc faddr_local;
  
  local_58.faddr = faddr;
  local_20 = sptr_to_self;
  sptr_to_self_local = (shared_ptr<tvm::runtime::ModuleNode> *)faddr;
  faddr_local = (BackendPackedCFunc)__return_storage_ptr__;
  std::shared_ptr<tvm::runtime::ModuleNode>::shared_ptr(&local_58.sptr_to_self,sptr_to_self);
  std::function<void(tvm::runtime::TVMArgs,tvm::runtime::TVMRetValue*)>::
  function<tvm::runtime::WrapPackedFunc(int(*)(void*,int*,int),std::shared_ptr<tvm::runtime::ModuleNode>const&)::__0,void>
            ((function<void(tvm::runtime::TVMArgs,tvm::runtime::TVMRetValue*)> *)&local_40,&local_58
            );
  PackedFunc::PackedFunc(__return_storage_ptr__,&local_40);
  std::function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)>::~function(&local_40);
  WrapPackedFunc(int(*)(void*,int*,int),std::shared_ptr<tvm::runtime::ModuleNode>const&)::$_0::~__0
            ((__0 *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

PackedFunc WrapPackedFunc(BackendPackedCFunc faddr,
                          const std::shared_ptr<ModuleNode> &sptr_to_self) {
  return PackedFunc([faddr, sptr_to_self](TVMArgs args, TVMRetValue *rv) {
    int ret = (*faddr)(
        const_cast<TVMValue *>(args.values),
        const_cast<int *>(args.type_codes),
        args.num_args);
    CHECK_EQ(ret, 0) << TVMGetLastError();
  });
}